

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

void __thiscall
cm::String::String<std::__cxx11::string_const&,void>
          (String *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  char local_40 [8];
  undefined8 uStack_38;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,(string *)s);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  if (local_50 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40) {
    local_30.field_2._8_8_ = uStack_38;
  }
  else {
    local_30._M_dataplus._M_p = (pointer)local_50;
  }
  local_30._M_string_length = local_48;
  local_48 = 0;
  local_40[0] = '\0';
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_40;
  String(this,&local_30,0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

String(T&& s)
    : String(IntoString<T>::into_string(std::forward<T>(s)), Private())
  {
  }